

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faces_kba.h
# Opt level: O2

Pointer * Faces_facexz_step(Faces *faces,int step)

{
  Pointer *pPVar1;
  uint uVar2;
  char *__assertion;
  
  if (faces == (Faces *)0x0) {
    __assertion = "faces != ((void*)0)";
    uVar2 = 0x7e;
  }
  else {
    if (-2 < step) {
      if (faces->is_face_comm_async == 0) {
        uVar2 = 0;
      }
      else {
        uVar2 = (step + 3U) % 3;
      }
      pPVar1 = Faces_facexz(faces,uVar2);
      return pPVar1;
    }
    __assertion = "step >= -1";
    uVar2 = 0x7f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/faces_kba.h"
                ,uVar2,"Pointer *Faces_facexz_step(Faces *, int)");
}

Assistant:

static Pointer* Faces_facexz_step( Faces* faces, int step )
{
  Assert( faces != NULL );
  Assert( step >= -1 );

  return Faces_facexz( faces,
                       Faces_is_face_comm_async( faces ) ? (step+3)%3 : 0 );
}